

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O3

void __thiscall DBSQLite::update(DBSQLite *this,Tle *tle)

{
  uint __val;
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  string __str;
  string q;
  ulong *local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  ulong local_1c0 [2];
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  undefined4 uStack_178;
  undefined4 uStack_174;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"INSERT OR REPLACE INTO tle (name, norad, line1, line2) ","");
  pcVar1 = (tle->name_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (tle->name_)._M_string_length);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1159d3);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_1a0 = *puVar8;
    lStack_198 = plVar5[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar8;
    local_1b0 = (ulong *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __val = tle->norad_number_;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar9 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0010b93b;
      }
      if (uVar9 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0010b93b;
      }
      if (uVar9 < 10000) goto LAB_0010b93b;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_0010b93b:
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d0,local_1c8,__val);
  uVar11 = CONCAT44(uStack_1c4,local_1c8) + local_1a8;
  uVar10 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar10 = local_1a0;
  }
  if (uVar10 < uVar11) {
    uVar10 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar10 = local_1c0[0];
    }
    if (uVar10 < uVar11) goto LAB_0010b9a7;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_0010b9a7:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_1d0);
  }
  local_170 = &local_160;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_160 = *plVar5;
    uStack_158 = puVar6[3];
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*puVar6;
  }
  local_168 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_180 = *puVar8;
    uStack_178 = (undefined4)plVar5[3];
    uStack_174 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar8;
    local_190 = (ulong *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar1 = (tle->line_one_)._M_dataplus._M_p;
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + (tle->line_one_)._M_string_length);
  uVar11 = 0xf;
  if (local_190 != &local_180) {
    uVar11 = local_180;
  }
  if (uVar11 < (ulong)(local_108 + local_188)) {
    uVar11 = 0xf;
    if (local_110 != local_100) {
      uVar11 = local_100[0];
    }
    if (uVar11 < (ulong)(local_108 + local_188)) goto LAB_0010bacc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_0010bacc:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_110);
  }
  local_150 = &local_140;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_140 = *plVar5;
    uStack_138 = puVar6[3];
  }
  else {
    local_140 = *plVar5;
    local_150 = (long *)*puVar6;
  }
  local_148 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = (undefined4)plVar5[3];
    uStack_d4 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
    local_f0 = (ulong *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar1 = (tle->line_two_)._M_dataplus._M_p;
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (tle->line_two_)._M_string_length);
  uVar11 = 0xf;
  if (local_f0 != &local_e0) {
    uVar11 = local_e0;
  }
  if (uVar11 < (ulong)(local_c8 + local_e8)) {
    uVar11 = 0xf;
    if (local_d0 != local_c0) {
      uVar11 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_e8) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0010bc38;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
LAB_0010bc38:
  local_130 = &local_120;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_120 = *plVar5;
    uStack_118 = puVar6[3];
  }
  else {
    local_120 = *plVar5;
    local_130 = (long *)*puVar6;
  }
  local_128 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_90,(ulong)local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  sqlite3_exec(this->_sql,local_90[0],0,0,0);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return;
}

Assistant:

void DBSQLite::update(const Tle &tle) {
  std::string q = "INSERT OR REPLACE INTO tle (name, norad, line1, line2) ";
  q += "VALUES (\'" + tle.Name() + "\', " + std::to_string(tle.NoradNumber()) +
       ", \"" + tle.Line1() + "\", \"" + tle.Line2() + "\");";
  sqlite3_exec(_sql, q.c_str(), nullptr, nullptr, nullptr);
}